

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
CTape::produce_letter_abi_cxx11_(string *__return_storage_ptr__,CTape *this,char letter)

{
  pointer pCVar1;
  string *__rhs;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  mapped_type *pmVar6;
  int iVar7;
  size_type *psVar8;
  long lVar9;
  int iVar10;
  size_type i;
  ulong uVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db_00;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  CNumber<30> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  l2t_t *local_78;
  string *local_70;
  int local_68;
  uint local_64;
  string local_60;
  int local_3c;
  int local_38;
  char local_31 [8];
  char letter_local;
  
  local_a8 = local_98;
  local_31[0] = letter;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"producing letter ","");
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a0,0,'\x01');
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    uVar12 = (undefined4)*psVar8;
    uVar13 = *(undefined4 *)((long)plVar5 + 0x14);
    local_60.field_2._M_allocated_capacity = *psVar8;
    local_60.field_2._8_4_ = (undefined4)plVar5[3];
    local_60.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar8;
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
    local_60._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_60._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  debug::log((double)CONCAT44(uVar13,uVar12));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88 = &this->m_pos;
  local_78 = &this->m_l2t;
  local_38 = -1;
  local_3c = 0x39;
  lVar9 = 0;
  uVar11 = 0;
  local_70 = __return_storage_ptr__;
  do {
    iVar10 = (int)uVar11;
    uVar2 = iVar10 % 0x1e + 0x1e;
    local_60._M_dataplus._M_p._0_4_ = (uVar2 / 0x1e) * -0x1f + uVar2 / 0x1e + iVar10 % 0x1e + 0x1e;
    uVar3 = CNumber<30>::shortest(local_88,(type *)&local_60);
    pCVar1 = (this->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar6 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](local_78,local_31);
    local_60._M_dataplus._M_p._0_4_ = (*pmVar6 % 0x1b + 0x1bU) % 0x1b;
    iVar4 = CNumber<27>::shortest
                      ((CNumber<27> *)((long)&pCVar1->m_number + lVar9),(type *)&local_60);
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    iVar7 = -iVar4;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
    iVar7 = iVar7 + uVar2;
    if (iVar7 < local_3c) {
      local_68 = iVar4;
      local_64 = uVar3;
      local_3c = iVar7;
      local_38 = iVar10;
    }
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 4;
  } while (uVar11 < (ulong)((long)(this->m_tape).
                                  super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_tape).
                                  super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  get_algorithm_abi_cxx11_(&local_60,(CTape *)(ulong)local_64,local_68,iVar7);
  __rhs = local_70;
  std::__cxx11::string::operator=((string *)local_70,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pmVar6 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](local_78,local_31);
  (this->m_tape).super__Vector_base<CNumber<27>,_std::allocator<CNumber<27>_>_>._M_impl.
  super__Vector_impl_data._M_start[local_38].m_number = (*pmVar6 % 0x1b + 0x1bU) % 0x1b;
  uVar2 = local_38 % 0x1e + 0x1e;
  (this->m_pos).m_number =
       uVar2 / 0x1e + uVar2 / 0x1e + (uVar2 / 0x1e) * -0x20 + local_38 % 0x1e + 0x1e;
  std::operator+(&local_60,"produced result: ",__rhs);
  debug::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __rhs;
}

Assistant:

std::string produce_letter(const char letter)
        {
            debug::log(std::string("producing letter ") + letter);
            std::string result;
            int min_pos = -1;
            int min_dist = TAPE_LENGTH + LETTERS_COUNT;  // Above in any way
            int min_move, min_change;
            for (tape_t::size_type i = 0; i < m_tape.size(); ++i)
            {
                int dist_move = m_pos.shortest(i);
                int dist_change = m_tape[i].shortest(m_l2t[letter]);
                int dist_res = std::abs(dist_move) + std::abs(dist_change);
                if (min_dist > dist_res)
                {
                    min_dist = dist_res;
                    min_move = dist_move;
                    min_change = dist_change;
                    min_pos = i;
                }
            }

            if (-1 == min_pos)
            {
                assert("broken logic");
            }

            result = get_algorithm(min_move, min_change);
            m_tape[min_pos] = m_l2t[letter];    // change tape
            m_pos = min_pos;                    // move pointer
            debug::log("produced result: " + result);
            return result;
        }